

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngerror.c
# Opt level: O0

void png_chunk_benign_error(png_const_structrp png_ptr,png_const_charp error_message)

{
  png_const_charp error_message_local;
  png_const_structrp png_ptr_local;
  
  if ((png_ptr->flags & 0x100000) != 0) {
    png_chunk_warning(png_ptr,error_message);
    return;
  }
  png_chunk_error(png_ptr,error_message);
}

Assistant:

void PNGAPI
png_chunk_benign_error(png_const_structrp png_ptr, png_const_charp
    error_message)
{
   if ((png_ptr->flags & PNG_FLAG_BENIGN_ERRORS_WARN) != 0)
      png_chunk_warning(png_ptr, error_message);

   else
      png_chunk_error(png_ptr, error_message);

#  ifndef PNG_ERROR_TEXT_SUPPORTED
      PNG_UNUSED(error_message)
#  endif
}